

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall
S2BooleanOperation::Impl::AddBoundary
          (Impl *this,int a_region_id,bool invert_a,bool invert_b,bool invert_result,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
          *a_chain_starts,CrossingProcessor *cp)

{
  byte bVar1;
  S2ShapeIndex *pSVar2;
  S2ShapeIndex *pSVar3;
  pointer pIVar4;
  ShapeEdgeId SVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  ShapeEdgeId SVar10;
  S2Shape *pSVar11;
  int extraout_var_01;
  int iVar12;
  ShapeEdgeId SVar13;
  ulong uVar14;
  int iVar15;
  ShapeEdgeId *pSVar16;
  int iVar17;
  ulong uVar18;
  CrossingIterator next_crossing;
  CrossingIterator local_70;
  S2LogMessage local_40;
  undefined4 extraout_var_00;
  
  pSVar2 = this->op_->regions_[a_region_id];
  pSVar3 = this->op_->regions_[1 - a_region_id];
  bVar6 = GetIndexCrossings(this,a_region_id);
  if (bVar6) {
    CrossingProcessor::StartBoundary(cp,a_region_id,invert_a,invert_b,invert_result);
    pSVar16 = (a_chain_starts->
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pIVar4 = (this->index_crossings_).
             super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70.b_shape_id_ = -1;
    local_70.crossings_complete_ = true;
    SVar10.shape_id = (pIVar4->a).shape_id;
    SVar10.edge_id = (pIVar4->a).edge_id;
    local_70.b_index_ = pSVar3;
    local_70.it_._M_current = pIVar4;
    if ((SVar10 != kSentinel) && (iVar8 = (pIVar4->b).shape_id, iVar8 != -1)) {
      local_70.b_shape_id_ = iVar8;
      iVar8 = (*pSVar3->_vptr_S2ShapeIndex[3])(pSVar3);
      local_70.b_shape_ = (S2Shape *)CONCAT44(extraout_var,iVar8);
      local_70.b_dimension_ = (*(local_70.b_shape_)->_vptr_S2Shape[4])(local_70.b_shape_);
      local_70.b_info_.chain_id = -1;
      SVar10.shape_id = (pIVar4->a).shape_id;
      SVar10.edge_id = (pIVar4->a).edge_id;
    }
    SVar13 = *pSVar16;
    uVar18 = (ulong)SVar13 >> 0x20;
    if ((SVar10.shape_id < SVar13.shape_id) ||
       ((SVar10.shape_id <= SVar13.shape_id && (SVar10.edge_id < SVar13.edge_id)))) {
      SVar13 = (ShapeEdgeId)((ulong)SVar10 & 0xffffffff);
      uVar18 = (ulong)SVar10 >> 0x20;
    }
    bVar6 = true;
    if (SVar13.shape_id != kSentinel.shape_id || (int)uVar18 != kSentinel.edge_id) {
      do {
        iVar12 = SVar13.shape_id;
        iVar8 = (*pSVar2->_vptr_S2ShapeIndex[3])(pSVar2,(ulong)SVar13 & 0xffffffff);
        pSVar11 = (S2Shape *)CONCAT44(extraout_var_00,iVar8);
        cp->a_shape_ = pSVar11;
        iVar8 = (*pSVar11->_vptr_S2Shape[4])();
        cp->a_dimension_ = iVar8;
        uVar14 = (ulong)SVar13 & 0xffffffff;
        do {
          iVar17 = (int)uVar18;
          uVar9 = (*pSVar11->_vptr_S2Shape[9])(pSVar11,uVar18);
          iVar8 = (*pSVar11->_vptr_S2Shape[7])(pSVar11,(ulong)uVar9);
          iVar15 = extraout_var_01 + iVar8;
          bVar6 = (*pSVar16).edge_id == iVar17 && iVar12 == (*pSVar16).shape_id;
          cp->chain_id_ = uVar9;
          cp->chain_start_ = iVar8;
          cp->chain_limit_ = iVar15;
          cp->inside_ = bVar6;
          cp->v0_emitted_max_edge_id_ = iVar8 + -1;
          cp->chain_v0_emitted_ = false;
          bVar1 = bVar6;
          while (iVar17 < iVar15) {
            if (((bVar1 & 1) == 0) &&
               ((iVar12 != ((local_70.it_._M_current)->a).shape_id ||
                ((int)uVar18 != ((local_70.it_._M_current)->a).edge_id)))) {
              S2LogMessage::S2LogMessage
                        (&local_40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                         ,0x6e5,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_40.stream_,
                         "Check failed: cp->inside() || next_crossing.a_id() == a_id ",0x3b);
              abort();
            }
            bVar7 = CrossingProcessor::ProcessEdge
                              (cp,(ShapeEdgeId)(uVar18 << 0x20 | uVar14),&local_70);
            if (!bVar7) goto LAB_0019e96f;
            bVar1 = cp->inside_;
            if ((bool)bVar1 == true) {
              uVar18 = (ulong)((int)uVar18 + 1);
            }
            else {
              SVar5 = (local_70.it_._M_current)->a;
              if ((iVar12 != SVar5.shape_id) ||
                 (uVar18 = (ulong)SVar5 >> 0x20, iVar15 <= SVar5.edge_id)) break;
            }
            iVar17 = (int)uVar18;
          }
          pSVar16 = pSVar16 + bVar6;
          SVar5 = (local_70.it_._M_current)->a;
          SVar13 = *pSVar16;
          uVar18 = (ulong)SVar13 >> 0x20;
          iVar8 = SVar13.edge_id;
          if ((SVar5.shape_id < SVar13.shape_id) ||
             ((SVar5.shape_id <= SVar13.shape_id && (SVar5.edge_id < iVar8)))) {
            SVar13 = (ShapeEdgeId)((ulong)SVar5 & 0xffffffff);
            uVar18 = (ulong)SVar5 >> 0x20;
            iVar8 = SVar5.edge_id;
          }
        } while (iVar12 == SVar13.shape_id);
      } while ((SVar13.shape_id != kSentinel.shape_id) || (iVar8 != kSentinel.edge_id));
      bVar6 = true;
    }
  }
  else {
LAB_0019e96f:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool S2BooleanOperation::Impl::AddBoundary(
    int a_region_id, bool invert_a, bool invert_b, bool invert_result,
    const vector<ShapeEdgeId>& a_chain_starts, CrossingProcessor* cp) {
  const S2ShapeIndex& a_index = *op_->regions_[a_region_id];
  const S2ShapeIndex& b_index = *op_->regions_[1 - a_region_id];
  if (!GetIndexCrossings(a_region_id)) return false;
  cp->StartBoundary(a_region_id, invert_a, invert_b, invert_result);

  // Walk the boundary of region A and build a list of all edge crossings.
  // We also keep track of whether the current vertex is inside region B.
  auto next_start = a_chain_starts.begin();
  CrossingIterator next_crossing(&b_index, &index_crossings_,
                                 true /*crossings_complete*/);
  ShapeEdgeId next_id = min(*next_start, next_crossing.a_id());
  while (next_id != kSentinel) {
    int a_shape_id = next_id.shape_id;
    const S2Shape& a_shape = *a_index.shape(a_shape_id);
    cp->StartShape(&a_shape);
    while (next_id.shape_id == a_shape_id) {
      // TODO(ericv): Special handling of dimension 0?  Can omit most of this
      // code, including the loop, since all chains are of length 1.
      int edge_id = next_id.edge_id;
      S2Shape::ChainPosition chain_position = a_shape.chain_position(edge_id);
      int chain_id = chain_position.chain_id;
      S2Shape::Chain chain = a_shape.chain(chain_id);
      bool start_inside = (next_id == *next_start);
      if (start_inside) ++next_start;
      cp->StartChain(chain_id, chain, start_inside);
      int chain_limit = chain.start + chain.length;
      while (edge_id < chain_limit) {
        ShapeEdgeId a_id(a_shape_id, edge_id);
        S2_DCHECK(cp->inside() || next_crossing.a_id() == a_id);
        if (!cp->ProcessEdge(a_id, &next_crossing)) {
          return false;
        }
        if (cp->inside()) {
          ++edge_id;
        } else if (next_crossing.a_id().shape_id == a_shape_id &&
                   next_crossing.a_id().edge_id < chain_limit) {
          edge_id = next_crossing.a_id().edge_id;
        } else {
          break;
        }
      }
      next_id = min(*next_start, next_crossing.a_id());
    }
  }
  return true;
}